

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::MultipleDriverVisitor::MultipleDriverVisitor(MultipleDriverVisitor *this)

{
  MultipleDriverVisitor *this_local;
  
  IRVisitor::IRVisitor(&this->super_IRVisitor);
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_00593758;
  return;
}

Assistant:

void visit(Generator* gen) override {
        auto var_names = gen->get_vars();
        for (auto const& name : var_names) {
            auto const& var = gen->get_var(name);
            check_var(var.get());
        }

        auto port_names = gen->get_port_names();
        for (auto const& name : port_names) {
            auto const& port = gen->get_port(name);
            check_var(port.get());
        }
    }